

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::SectionStats::SectionStats
          (SectionStats *this,SectionInfo *_sectionInfo,Counts *_assertions,
          double _durationInSeconds,bool _missingAssertions)

{
  size_t sVar1;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_0016ecd0;
  SectionInfo::SectionInfo(&this->sectionInfo,_sectionInfo);
  (this->assertions).failedButOk = _assertions->failedButOk;
  sVar1 = _assertions->failed;
  (this->assertions).passed = _assertions->passed;
  (this->assertions).failed = sVar1;
  this->durationInSeconds = _durationInSeconds;
  this->missingAssertions = _missingAssertions;
  return;
}

Assistant:

SectionStats(   SectionInfo const& _sectionInfo,
                        Counts const& _assertions,
                        double _durationInSeconds,
                        bool _missingAssertions )
        :   sectionInfo( _sectionInfo ),
            assertions( _assertions ),
            durationInSeconds( _durationInSeconds ),
            missingAssertions( _missingAssertions )
        {}